

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesBoolWidget.cxx
# Opt level: O0

void __thiscall cmCursesBoolWidget::SetValueAsBool(cmCursesBoolWidget *this,bool value)

{
  bool bVar1;
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [39];
  undefined1 local_11;
  cmCursesBoolWidget *pcStack_10;
  bool value_local;
  cmCursesBoolWidget *this_local;
  
  local_11 = value;
  pcStack_10 = this;
  if (value) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,"ON",&local_39);
    (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
    bVar1 = cmCursesColor::HasColors();
    if (bVar1) {
      set_field_fore((this->super_cmCursesWidget).Field,0x200);
      set_field_back((this->super_cmCursesWidget).Field,0x200);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_70,"OFF",&local_71);
    (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,local_70);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator(&local_71);
    bVar1 = cmCursesColor::HasColors();
    if (bVar1) {
      set_field_fore((this->super_cmCursesWidget).Field,0x100);
      set_field_back((this->super_cmCursesWidget).Field,0x100);
    }
  }
  return;
}

Assistant:

void cmCursesBoolWidget::SetValueAsBool(bool value)
{
  if (value) {
    this->SetValue("ON");
    if (cmCursesColor::HasColors()) {
      set_field_fore(this->Field, COLOR_PAIR(cmCursesColor::BoolOn));
      set_field_back(this->Field, COLOR_PAIR(cmCursesColor::BoolOn));
    }
  } else {
    this->SetValue("OFF");
    if (cmCursesColor::HasColors()) {
      set_field_fore(this->Field, COLOR_PAIR(cmCursesColor::BoolOff));
      set_field_back(this->Field, COLOR_PAIR(cmCursesColor::BoolOff));
    }
  }
}